

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.hpp
# Opt level: O1

UVec3 __thiscall vkt::pipeline::TestTexture3D::getTextureDimension(TestTexture3D *this)

{
  uint uVar1;
  undefined8 *in_RDI;
  UVec3 UVar2;
  
  uVar1 = (this->m_texture).m_depth;
  *in_RDI = *(undefined8 *)&(this->m_texture).m_width;
  *(uint *)(in_RDI + 1) = uVar1;
  UVar2.m_data[2] = uVar1;
  UVar2.m_data._0_8_ = in_RDI;
  return (UVec3)UVar2.m_data;
}

Assistant:

virtual tcu::UVec3							getTextureDimension	(void) const { return tcu::UVec3(m_texture.getWidth(), m_texture.getHeight(), m_texture.getDepth()); }